

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O1

_Bool seq_from(Env *env,char *s,uint32_t start)

{
  char cVar1;
  State *pSVar2;
  uint32_t rel;
  size_t sVar3;
  uint uVar4;
  TSLexer *pTVar5;
  long lVar6;
  uint uVar7;
  _Bool _Var8;
  
  sVar3 = strlen(s);
  uVar7 = (uint)sVar3;
  _Var8 = uVar7 == 0;
  if (!_Var8) {
    lVar6 = 0;
    do {
      cVar1 = s[lVar6];
      rel = (int)lVar6 + start;
      pSVar2 = env->state;
      uVar4 = (pSVar2->lookahead).offset + rel;
      if (uVar4 < (pSVar2->lookahead).size) {
        pTVar5 = (TSLexer *)((pSVar2->lookahead).contents + uVar4);
      }
      else {
        advance_before(env,rel);
        pTVar5 = env->lexer;
      }
      if (pTVar5->lookahead != (int)cVar1) {
        return _Var8;
      }
      lVar6 = lVar6 + 1;
      _Var8 = uVar7 <= (uint)lVar6;
    } while (uVar7 != (uint)lVar6);
  }
  if ((env->state->lookahead).size <= (env->state->lookahead).offset + start + uVar7) {
    advance_before(env,start + uVar7);
  }
  return _Var8;
}

Assistant:

static bool seq_from(Env *env, const char *restrict s, uint32_t start) {
  uint32_t len = (uint32_t) strlen(s);
  for (uint32_t i = 0; i < len; i++) {
    int32_t c = s[i];
    int32_t c2 = peek(env, start + i);
    if (c != c2) return false;
  }
  peek(env, start + len);
  return true;
}